

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_16f66::reduceY<unsigned_int>
               (TypedImageChannel<unsigned_int> *channel0,TypedImageChannel<unsigned_int> *channel1,
               bool filter,Extrapolation ext,bool odd)

{
  int iVar1;
  int h;
  int x_00;
  uint uVar2;
  Image *pIVar3;
  uint *puVar4;
  byte in_DL;
  ImageChannel *in_RSI;
  ImageChannel *in_RDI;
  undefined1 in_R8B;
  int x_1;
  int y_1;
  int offset;
  int x;
  int y;
  double f;
  int h1;
  int h0;
  int w1;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  double local_50;
  int local_44;
  int local_40;
  int local_38;
  Extrapolation ext_00;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = CONCAT13(in_R8B,in_stack_ffffffffffffffe4) & 0x1ffffff;
  pIVar3 = ImageChannel::image(in_RSI);
  iVar1 = Image::width(pIVar3);
  pIVar3 = ImageChannel::image(in_RDI);
  h = Image::height(pIVar3);
  pIVar3 = ImageChannel::image(in_RSI);
  x_00 = Image::height(pIVar3);
  if ((in_DL & 1) == 0) {
    for (local_40 = 0; local_40 < x_00; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
        puVar4 = TypedImageChannel<unsigned_int>::operator()
                           ((TypedImageChannel<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa4 = *puVar4;
        puVar4 = TypedImageChannel<unsigned_int>::operator()
                           ((TypedImageChannel<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        *puVar4 = in_stack_ffffffffffffffa4;
      }
    }
  }
  else {
    if (x_00 < 2) {
      local_50 = 1.0;
    }
    else {
      local_50 = (double)(h + -2) / (double)(x_00 + -1);
    }
    for (ext_00 = BLACK; (int)ext_00 < x_00; ext_00 = ext_00 + CLAMP) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        uVar2 = filterY<unsigned_int>
                          ((TypedImageChannel<unsigned_int> *)CONCAT44(uVar5,iVar1),h,x_00,local_50,
                           ext_00);
        puVar4 = TypedImageChannel<unsigned_int>::operator()
                           ((TypedImageChannel<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        *puVar4 = uVar2;
      }
    }
  }
  return;
}

Assistant:

void
reduceY (
    const TypedImageChannel<T>& channel0,
    TypedImageChannel<T>&       channel1,
    bool                        filter,
    Extrapolation               ext,
    bool                        odd)
{
    //
    // Shrink an image channel, channel0, vertically
    // by a factor of 2, and store the result in channel1.
    //

    int w1 = channel1.image ().width ();
    int h0 = channel0.image ().height ();
    int h1 = channel1.image ().height ();

    if (filter)
    {
        //
        // Low-pass filter and resample.
        // For pixels (x, 0) and (x, h1 - 1) in channel 1,
        // the low-pass filter in channel0 is centered on
        // pixels (x, 0.5) and (x, h0 - 1.5) respectively.
        //

        double f = (h1 > 1) ? double (h0 - 2) / (h1 - 1) : 1;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = filterY (channel0, h0, x, y * f, ext);
    }
    else
    {
        //
        // Resample, skipping every other pixel, without
        // low-pass filtering.  In order to keep the image
        // from sliding towards the top if the channel is
        // resampled repeatedly, we skip the top pixel of
        // every column on even passes, and the bottom pixel
        // on odd passes.
        //

        int offset = odd ? ((h0 - 1) - 2 * (h1 - 1)) : 0;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = channel0 (x, 2 * y + offset);
    }
}